

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer-crit.cpp
# Opt level: O1

bool usesTheVariable(Instruction *I,string *var,bool isglobal,LLVMPointerAnalysis *pta)

{
  Instruction IVar1;
  ConstantExpr CVar2;
  ulong uVar3;
  size_t sVar4;
  char cVar5;
  int iVar6;
  raw_ostream *prVar7;
  ConstantExpr *CE;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  Value *pVVar10;
  _Base_ptr p_Var11;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  StringRef Str;
  StringRef Str_00;
  undefined1 auVar15 [16];
  pair<bool,_dg::LLVMMemoryRegionSet> memacc;
  Instruction local_68 [8];
  _Rb_tree<llvm::Value_*,_std::pair<llvm::Value_*const,_std::vector<dg::LLVMMemoryRegionSet::OffsetPair,_std::allocator<dg::LLVMMemoryRegionSet::OffsetPair>_>_>,_std::_Select1st<std::pair<llvm::Value_*const,_std::vector<dg::LLVMMemoryRegionSet::OffsetPair,_std::allocator<dg::LLVMMemoryRegionSet::OffsetPair>_>_>_>,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_std::vector<dg::LLVMMemoryRegionSet::OffsetPair,_std::allocator<dg::LLVMMemoryRegionSet::OffsetPair>_>_>_>_>
  local_60 [8];
  _Rb_tree_node_base local_58;
  
  cVar5 = llvm::Instruction::mayReadFromMemory();
  if ((cVar5 == '\0') && (cVar5 = llvm::Instruction::mayWriteToMemory(), cVar5 == '\0')) {
    return false;
  }
  if (pta != (LLVMPointerAnalysis *)0x0) {
    dg::LLVMPointerAnalysis::getAccessedMemory(local_68);
    if (local_68[0] == (Instruction)0x1) {
      prVar7 = (raw_ostream *)llvm::errs();
      Str.Length = 0x2f;
      Str.Data = "WARNING: matched due to a lack of information: ";
      prVar7 = llvm::raw_ostream::operator<<(prVar7,Str);
      llvm::Value::print((raw_ostream *)I,SUB81(prVar7,0));
      Str_00.Length = 1;
      Str_00.Data = "\n";
      llvm::raw_ostream::operator<<(prVar7,Str_00);
      bVar13 = true;
    }
    else {
      bVar13 = local_58._M_left != &local_58;
      if (bVar13) {
        uVar12 = 0;
        p_Var9 = local_58._M_left;
        do {
          uVar3 = *(ulong *)(p_Var9 + 1);
          if ((!isglobal) || (cVar5 = '\x03', *(char *)(uVar3 + 0x10) == '\x03')) {
            bVar14 = *(char *)(uVar3 + 0x10) != '\x03';
            cVar5 = bVar14;
            if (uVar3 != 0 && !bVar14) {
              auVar15 = llvm::Value::getName();
              sVar4 = var->_M_string_length;
              if (auVar15._8_8_ == sVar4) {
                if (sVar4 == 0) {
                  cVar5 = true;
                }
                else {
                  iVar6 = bcmp(auVar15._0_8_,(var->_M_dataplus)._M_p,sVar4);
                  cVar5 = iVar6 == 0;
                }
              }
              else {
                cVar5 = false;
              }
            }
            if (uVar3 == 0 || bVar14) {
              p_Var8 = &valuesToVariables_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
              if (valuesToVariables_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_parent != (_Base_ptr)0x0) {
                p_Var8 = &valuesToVariables_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
                p_Var11 = valuesToVariables_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header.
                          _M_parent;
                do {
                  if (*(ulong *)(p_Var11 + 1) >= uVar3) {
                    p_Var8 = p_Var11;
                  }
                  p_Var11 = (&p_Var11->_M_left)[*(ulong *)(p_Var11 + 1) < uVar3];
                } while (p_Var11 != (_Base_ptr)0x0);
              }
              p_Var11 = &valuesToVariables_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
              if (((_Rb_tree_header *)p_Var8 !=
                   &valuesToVariables_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) &&
                 (p_Var11 = p_Var8, uVar3 < *(ulong *)(p_Var8 + 1))) {
                p_Var11 = &valuesToVariables_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header
                ;
              }
              if (((_Rb_tree_header *)p_Var11 ==
                   &valuesToVariables_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) ||
                 ((p_Var8 = p_Var11[1]._M_left, p_Var8 == (_Base_ptr)var->_M_string_length &&
                  ((p_Var8 == (_Base_ptr)0x0 ||
                   (iVar6 = bcmp(p_Var11[1]._M_parent,(var->_M_dataplus)._M_p,(size_t)p_Var8),
                   iVar6 == 0)))))) {
                cVar5 = '\x01';
              }
              else {
                cVar5 = '\0';
              }
            }
          }
          if ((cVar5 != '\x03') && (cVar5 != '\0')) break;
          uVar12 = uVar12 + 1;
          if ((ulong)((long)p_Var9[1]._M_left - (long)p_Var9[1]._M_parent >> 4) <= uVar12) {
            p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
            uVar12 = 0;
          }
          bVar13 = p_Var9 != &local_58 || uVar12 != 0;
        } while (p_Var9 != &local_58 || uVar12 != 0);
      }
    }
    std::
    _Rb_tree<llvm::Value_*,_std::pair<llvm::Value_*const,_std::vector<dg::LLVMMemoryRegionSet::OffsetPair,_std::allocator<dg::LLVMMemoryRegionSet::OffsetPair>_>_>,_std::_Select1st<std::pair<llvm::Value_*const,_std::vector<dg::LLVMMemoryRegionSet::OffsetPair,_std::allocator<dg::LLVMMemoryRegionSet::OffsetPair>_>_>_>,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_std::vector<dg::LLVMMemoryRegionSet::OffsetPair,_std::allocator<dg::LLVMMemoryRegionSet::OffsetPair>_>_>_>_>
    ::_M_erase(local_60,(_Link_type)local_58._M_parent);
    return bVar13;
  }
  IVar1 = I[0x10];
  pVVar10 = (Value *)(ulong)(byte)IVar1;
  if ((IVar1 == (Instruction)0x3b) || (IVar1 == (Instruction)0x3c)) {
    CE = (ConstantExpr *)llvm::Value::stripPointerCasts();
    CVar2 = CE[0x10];
    pVVar10 = (Value *)(ulong)(byte)CVar2;
    if (CE != (ConstantExpr *)0x0 && CVar2 == (ConstantExpr)0x5) {
      pVVar10 = constExprVar(CE);
      CE = (ConstantExpr *)pVVar10;
      goto LAB_00127a78;
    }
    if ((CVar2 == (ConstantExpr)0x3a) || (CVar2 == (ConstantExpr)0x3)) goto LAB_00127a78;
  }
  CE = (ConstantExpr *)0x0;
LAB_00127a78:
  if (CE != (ConstantExpr *)0x0) {
    CVar2 = CE[0x10];
    if (CVar2 == (ConstantExpr)0x3) {
      auVar15 = llvm::Value::getName();
      sVar4 = var->_M_string_length;
      if (auVar15._8_8_ == sVar4) {
        if (sVar4 == 0) {
          pVVar10 = (Value *)0x1;
        }
        else {
          iVar6 = bcmp(auVar15._0_8_,(var->_M_dataplus)._M_p,sVar4);
          pVVar10 = (Value *)(ulong)(iVar6 == 0);
        }
      }
      else {
        pVVar10 = (Value *)0x0;
      }
    }
    if (CVar2 == (ConstantExpr)0x3) {
      if (((ulong)pVVar10 & 1) == 0) {
        return false;
      }
    }
    else {
      p_Var9 = &valuesToVariables_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
      if (valuesToVariables_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
          (_Base_ptr)0x0) {
        p_Var9 = &valuesToVariables_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
        p_Var8 = valuesToVariables_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
        ;
        do {
          if (*(ConstantExpr **)(p_Var8 + 1) >= CE) {
            p_Var9 = p_Var8;
          }
          p_Var8 = (&p_Var8->_M_left)[*(ConstantExpr **)(p_Var8 + 1) < CE];
        } while (p_Var8 != (_Base_ptr)0x0);
      }
      p_Var8 = &valuesToVariables_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
      if (((_Rb_tree_header *)p_Var9 !=
           &valuesToVariables_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) &&
         (p_Var8 = &valuesToVariables_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header,
         *(ConstantExpr **)(p_Var9 + 1) <= CE)) {
        p_Var8 = p_Var9;
      }
      if ((_Rb_tree_header *)p_Var8 !=
          &valuesToVariables_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
        p_Var9 = p_Var8[1]._M_left;
        if (p_Var9 != (_Base_ptr)var->_M_string_length) {
          return false;
        }
        if ((p_Var9 != (_Base_ptr)0x0) &&
           (iVar6 = bcmp(p_Var8[1]._M_parent,(var->_M_dataplus)._M_p,(size_t)p_Var9), iVar6 != 0)) {
          return false;
        }
      }
    }
  }
  return true;
}

Assistant:

static bool usesTheVariable(const llvm::Instruction &I, const std::string &var,
                            bool isglobal = false,
                            LLVMPointerAnalysis *pta = nullptr) {
    if (!I.mayReadOrWriteMemory())
        return false;

    if (!pta) {
        // try basic cases that we can decide without PTA
        using namespace llvm;
        const Value *operand = nullptr;
        if (auto *S = dyn_cast<StoreInst>(&I)) {
            auto *A = S->getPointerOperand()->stripPointerCasts();
            if (auto *C = dyn_cast<ConstantExpr>(A)) {
                operand = constExprVar(C);
            } else if ((isa<AllocaInst>(A) || isa<GlobalVariable>(A))) {
                operand = A;
            }
        } else if (auto *L = dyn_cast<LoadInst>(&I)) {
            auto *A = L->getPointerOperand()->stripPointerCasts();
            if (auto *C = dyn_cast<ConstantExpr>(A)) {
                operand = constExprVar(C);
            } else if ((isa<AllocaInst>(A) || isa<GlobalVariable>(A))) {
                operand = A;
            }
        }

        if (operand && !mayBeTheVar(operand, var)) {
            return false;
        }
        return true;
    }

    auto memacc = pta->getAccessedMemory(&I);
    if (memacc.first) {
        // PTA has no information, it may be a definition of the variable,
        // we do not know
        llvm::errs() << "WARNING: matched due to a lack of information: " << I
                     << "\n";
        return true;
    }

    for (const auto &region : memacc.second) {
        if (isglobal &&
            !llvm::isa<llvm::GlobalVariable>(region.pointer.value)) {
            continue;
        }
        if (mayBeTheVar(region.pointer.value, var)) {
            return true;
        }
    }

    return false;
}